

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::pair<int,double>>
               (AVisitor<hiberlite::KillChildren> *ar,
               set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
               *m,uint param_3)

{
  _Base_ptr p_Var1;
  allocator local_c1;
  string local_c0 [32];
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_a0;
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_60;
  
  std::__cxx11::string::string(local_c0,"items",&local_c1);
  p_Var1 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_60,local_c0);
  local_60.stream.xx.first = 0;
  local_60.stream.xx.second = 0.0;
  local_60.stream.ct = m;
  local_60.stream.it._M_node = p_Var1;
  std::__cxx11::string::~string(local_c0);
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::collection_nvp(&local_a0,&local_60);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void hibernate(A& ar, std::set<Key>& m, const unsigned int)
{
	typedef Key ElType;
	collection_nvp<ElType,stl_stream_adapter<ElType,std::set<Key> > >
			body( "items", stl_stream_adapter<ElType,std::set<Key> >(m) );
	ar & body;
}